

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.hpp
# Opt level: O0

void __thiscall antlr::CommonToken::~CommonToken(CommonToken *this)

{
  Token *in_RDI;
  
  in_RDI->_vptr_Token = (_func_int **)&PTR__CommonToken_004fcf70;
  std::__cxx11::string::~string((string *)&in_RDI[1].ref);
  Token::~Token(in_RDI);
  return;
}

Assistant:

class ANTLR_API CommonToken : public Token {
public:
	CommonToken();
	CommonToken(int t, const ANTLR_USE_NAMESPACE(std)string& txt);
	CommonToken(const ANTLR_USE_NAMESPACE(std)string& s);

	/// return contents of token
	virtual ANTLR_USE_NAMESPACE(std)string getText() const
	{
		return text;
	}

	/// set contents of token
	virtual void setText(const ANTLR_USE_NAMESPACE(std)string& s)
	{
		text = s;
	}

	/** get the line the token is at (starting at 1)
	 * @see CharScanner::newline()
	 * @see CharScanner::tab()
	 */
	virtual int getLine() const
	{
		return line;
	}
	/** gt the column the token is at (starting at 1)
	 * @see CharScanner::newline()
	 * @see CharScanner::tab()
	 */
	virtual int getColumn() const
	{
		return col;
	}

	/// set line for token
	virtual void setLine(int l)
	{
		line = l;
	}
	/// set column for token
	virtual void setColumn(int c)
	{
		col = c;
	}

	virtual ANTLR_USE_NAMESPACE(std)string toString() const;
	static RefToken factory();

protected:
	// most tokens will want line and text information
	int line;
	int col;
	ANTLR_USE_NAMESPACE(std)string text;

private:
	CommonToken(const CommonToken&);
	const CommonToken& operator=(const CommonToken&);
}